

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

fdb_status sb_read_latest(filemgr *file,sb_config sconfig,err_log_callback *log_callback)

{
  atomic<unsigned_long> *paVar1;
  byte bVar2;
  uint uVar3;
  crc_mode_e mode;
  _func_ssize_t_int_void_ptr_size_t_cs_off_t *p_Var4;
  _func_void_char_ptr_size_t *p_Var5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  byte bVar9;
  uint64_t uVar10;
  _Invoker_type p_Var11;
  code *pcVar12;
  ulong *buf;
  err_log_callback *peVar13;
  filemgr *pfVar14;
  bool bVar15;
  int iVar16;
  uint32_t uVar17;
  void *pvVar18;
  ssize_t sVar19;
  sb_rsv_bmp *psVar20;
  bid_t *pbVar21;
  docio_object *pdVar22;
  superblock *psVar23;
  fdb_status fVar24;
  size_t buf_len;
  long lVar25;
  long lVar26;
  undefined7 in_register_00000031;
  ulong uVar27;
  superblock *psVar28;
  size_t __n;
  ulong uVar29;
  ulong uVar30;
  ulong auStack_300 [5];
  undefined1 local_2d8 [512];
  undefined1 local_d8 [8];
  FdbGcFunc gc;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  void *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong *local_68;
  void *buf_aligned;
  err_log_callback *local_58;
  sb_rsv_bmp *local_50;
  undefined4 local_44;
  filemgr *local_40;
  superblock *local_38;
  
  uVar27 = (ulong)sconfig.num_sb;
  local_58 = log_callback;
  if (file->sb == (superblock *)0x0) {
    local_88 = (void *)0xffffffffffffffff;
  }
  else {
    local_88 = (void *)((file->sb->revnum).super___atomic_base<unsigned_long>._M_i - 1);
    auStack_300[4] = 0x1385d0;
    sb_free(file);
  }
  lVar8 = -(ulong)((uint)sconfig.num_sb * 40000);
  *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x1385fa;
  memset(local_2d8 + lVar8,0,uVar27 * 200);
  if (sconfig.num_sb == '\0') {
    fVar24 = FDB_RESULT_SB_READ_FAIL;
  }
  else {
    local_44 = (undefined4)CONCAT71(in_register_00000031,sconfig.num_sb);
    uVar30 = 0;
    pvVar18 = (void *)0x0;
    gc.func._M_invoker = (_Invoker_type)(local_2d8 + lVar8);
    local_78 = uVar27;
    local_70 = uVar27;
    local_40 = file;
    do {
      uVar27 = local_70;
      p_Var11 = gc.func._M_invoker;
      buf_aligned = pvVar18;
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138633;
      pvVar18 = calloc(1,1);
      psVar28 = (superblock *)(p_Var11 + uVar30 * 200);
      *(void **)(p_Var11 + uVar30 * 200) = pvVar18;
      local_38 = psVar28;
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x13864e;
      _sb_init(psVar28,(sb_config)(uint8_t)uVar27);
      uVar3 = file->blocksize;
      local_68 = (ulong *)0x0;
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x13866b;
      iVar16 = posix_memalign(&local_68,0x200,(ulong)uVar3);
      if (iVar16 != 0) {
        local_68 = (ulong *)0x0;
      }
      buf = local_68;
      local_a8._8_8_ = 0;
      local_a8._M_unused._M_object = &local_68;
      local_90 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc:1392:18)>
                 ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc:1392:18)>
                 ::_M_manager;
      local_d8[0] = false;
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x1386cc;
      std::function<void_()>::function((function<void_()> *)&gc,(function<void_()> *)&local_a8);
      pcVar12 = local_98;
      if (local_98 != (code *)0x0) {
        *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x1386e9;
        (*pcVar12)(&local_a8,&local_a8,__destroy_functor);
      }
      __n = (size_t)(int)uVar3;
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x1386f9;
      memset(buf,0,__n);
      file = local_40;
      iVar16 = local_40->fd;
      p_Var4 = local_40->ops->pread;
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x13871b;
      sVar19 = (*p_Var4)(iVar16,buf,__n,uVar30 * __n);
      peVar13 = local_58;
      if (uVar3 == (uint)sVar19) {
        bVar2 = *(byte *)((long)buf + (long)(int)(uVar3 - 1));
        if (bVar2 == 0xcc) {
          uVar27 = *buf;
          uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                   (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                   (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                   (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
          local_80 = uVar27;
          *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x13874b;
          bVar15 = ver_superblock_support(uVar27);
          psVar28 = local_38;
          peVar13 = local_58;
          if (bVar15) {
            uVar27 = buf[1];
            LOCK();
            (local_38->revnum).super___atomic_base<unsigned_long>._M_i =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[2];
            LOCK();
            (psVar28->bmp_revnum).super___atomic_base<unsigned_long>._M_i =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[3];
            LOCK();
            (psVar28->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[4];
            LOCK();
            (psVar28->last_hdr_bid).super___atomic_base<unsigned_long>._M_i =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[5];
            LOCK();
            (psVar28->last_hdr_revnum).super___atomic_base<unsigned_long>._M_i =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[6];
            psVar28->min_live_hdr_revnum =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[7];
            psVar28->min_live_hdr_bid =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[8];
            psVar28->num_init_free_blocks =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[9];
            psVar28->num_free_blocks =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[10];
            uVar29 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            LOCK();
            (psVar28->bmp_size).super___atomic_base<unsigned_long>._M_i = uVar29;
            UNLOCK();
            uVar27 = buf[0xb];
            if (uVar27 == 0) {
              psVar20 = (sb_rsv_bmp *)0x0;
            }
            else {
              *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x1387f9;
              psVar20 = (sb_rsv_bmp *)calloc(1,0x68);
              psVar20->bmp = (uint8_t *)0x0;
              psVar20->bmp_size =
                   uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                   (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                   (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                   (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              psVar20->cur_alloc_bid = 0xffffffffffffffff;
              LOCK();
              (psVar20->status).super___atomic_base<unsigned_int>._M_i = 1;
              UNLOCK();
            }
            psVar28 = local_38;
            LOCK();
            (local_38->bmp)._M_b._M_p = (__pointer_type)0x0;
            UNLOCK();
            uVar29 = uVar29 + 0x7fffff;
            uVar27 = uVar29 >> 0x17;
            psVar28->num_bmp_docs = uVar27;
            buf_len = 0x60;
            if (0x7fffff < uVar29) {
              local_50 = psVar20;
              *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x13894e;
              pbVar21 = (bid_t *)calloc(uVar27,8);
              psVar28 = local_38;
              local_38->bmp_doc_offset = pbVar21;
              *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138966;
              pdVar22 = (docio_object *)calloc(uVar27,0x38);
              psVar28->bmp_docs = pdVar22;
              lVar26 = 0;
              do {
                lVar25 = lVar26;
                uVar29 = *(ulong *)((long)buf + lVar25 + 0x60);
                *(ulong *)((long)pbVar21 + lVar25) =
                     uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                     (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                     (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                     (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
                lVar26 = lVar25 + 8;
              } while (uVar27 * 8 != lVar25 + 8);
              buf_len = lVar25 + 0x68;
              psVar20 = local_50;
            }
            file = local_40;
            if (psVar20 != (sb_rsv_bmp *)0x0) {
              uVar27 = psVar20->bmp_size + 0x7fffff;
              uVar29 = uVar27 >> 0x17;
              psVar20->num_bmp_docs = uVar29;
              if (0x7fffff < uVar27) {
                local_50 = psVar20;
                *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x1389c6;
                pbVar21 = (bid_t *)calloc(uVar29,8);
                local_50->bmp_doc_offset = pbVar21;
                *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x1389de;
                pdVar22 = (docio_object *)calloc(uVar29,0x38);
                local_50->bmp_docs = pdVar22;
                lVar26 = -buf_len;
                uVar27 = 0;
                do {
                  uVar6 = *(ulong *)((long)buf + uVar27 * 8 + buf_len);
                  pbVar21[uVar27] =
                       uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                       (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                       (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                       (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
                  uVar27 = uVar27 + 1;
                  lVar26 = lVar26 + -8;
                } while (uVar29 != uVar27);
                buf_len = -lVar26;
                psVar20 = local_50;
              }
              file = local_40;
              local_38->rsv_bmp = psVar20;
            }
            mode = file->crc_mode;
            *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138a30;
            uVar17 = get_checksum((uint8_t *)buf,buf_len,mode);
            psVar28 = local_38;
            pvVar18 = buf_aligned;
            uVar3 = *(uint *)((long)buf + buf_len);
            bVar9 = 1;
            if (uVar17 != (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18)) {
              pbVar21 = local_38->bmp_doc_offset;
              *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138a4e;
              free(pbVar21);
              pdVar22 = psVar28->bmp_docs;
              *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138a57;
              free(pdVar22);
              psVar28->bmp_doc_offset = (bid_t *)0x0;
              psVar28->bmp_docs = (docio_object *)0x0;
              peVar13 = local_58;
              bVar9 = 0;
              *(ulong *)((long)auStack_300 + lVar8 + 0x18) = uVar30;
              *(ulong *)((long)auStack_300 + lVar8 + 0x10) = local_80;
              *(char **)((long)auStack_300 + lVar8 + 8) =
                   "Failed to read the superblock: not supported version (magic: %lu, SB No.: %lu)";
              *(undefined8 *)((long)auStack_300 + lVar8) = 0x138a9b;
              fdb_log_impl(peVar13,3,FDB_RESULT_SB_READ_FAIL,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                           ,"_sb_read_given_no",0x613,*(char **)((long)auStack_300 + lVar8 + 8));
            }
          }
          else {
            bVar9 = 0;
            *(ulong *)((long)auStack_300 + lVar8 + 0x18) = uVar30;
            *(ulong *)((long)auStack_300 + lVar8 + 0x10) = local_80;
            *(char **)((long)auStack_300 + lVar8 + 8) =
                 "Failed to read the superblock: not supported version (magic: %lu, SB No.: %lu)";
            *(undefined8 *)((long)auStack_300 + lVar8) = 0x138904;
            fdb_log_impl(peVar13,3,FDB_RESULT_SB_READ_FAIL,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                         ,"_sb_read_given_no",0x59c,*(char **)((long)auStack_300 + lVar8 + 8));
            pvVar18 = buf_aligned;
          }
        }
        else {
          bVar9 = 0;
          *(ulong *)((long)auStack_300 + lVar8 + 0x18) = uVar30;
          *(ulong *)((long)auStack_300 + lVar8 + 0x10) = (ulong)bVar2;
          *(char **)((long)auStack_300 + lVar8 + 8) =
               "Failed to read the superblock: incorrect block marker (marker: %x, SB No.: %lu). Note: this message might be a false alarm if upgrade is running."
          ;
          *(undefined8 *)((long)auStack_300 + lVar8) = 0x1388ba;
          fdb_log_impl(peVar13,3,FDB_RESULT_SB_READ_FAIL,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                       ,"_sb_read_given_no",0x58d,*(char **)((long)auStack_300 + lVar8 + 8));
          pvVar18 = buf_aligned;
        }
      }
      else {
        p_Var5 = file->ops->get_errno_str;
        *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138836;
        (*p_Var5)(local_2d8,0x200);
        peVar13 = local_58;
        *(undefined1 **)((long)auStack_300 + lVar8 + 0x18) = local_2d8;
        *(ulong *)((long)auStack_300 + lVar8 + 0x10) = uVar30;
        *(char **)((long)auStack_300 + lVar8 + 8) =
             "Failed to read the superblock: file read failure (SB No.: %lu), %s";
        *(undefined8 *)((long)auStack_300 + lVar8) = 0x13886f;
        fdb_log_impl(peVar13,3,FDB_RESULT_SB_READ_FAIL,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                     ,"_sb_read_given_no",0x582,*(char **)((long)auStack_300 + lVar8 + 8));
        bVar9 = 0;
        pvVar18 = buf_aligned;
      }
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138aab;
      FdbGcFunc::~FdbGcFunc((FdbGcFunc *)local_d8);
      psVar28 = (superblock *)gc.func._M_invoker;
      pvVar7 = (void *)(local_38->revnum).super___atomic_base<unsigned_long>._M_i;
      uVar27 = local_78;
      if ((bool)(pvVar18 <= pvVar7 & bVar9 & pvVar7 < local_88)) {
        uVar27 = uVar30;
        pvVar18 = pvVar7;
      }
      uVar30 = uVar30 + 1;
      local_78 = uVar27;
    } while (uVar30 != local_70);
    if (uVar27 == local_70) {
      fVar24 = FDB_RESULT_SB_READ_FAIL;
      uVar27 = local_70;
      if ((char)local_44 != '\0') {
        do {
          *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138b0f;
          _sb_free(psVar28);
          uVar27 = uVar27 - 1;
          psVar28 = psVar28 + 1;
        } while (uVar27 != 0);
      }
    }
    else {
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138b39;
      psVar23 = (superblock *)calloc(1,200);
      file->sb = psVar23;
      lVar26 = uVar27 * 200;
      psVar23->config = *(sb_config **)((long)psVar28 + lVar26);
      LOCK();
      (psVar23->revnum).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 8);
      UNLOCK();
      LOCK();
      (psVar23->bmp_revnum).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 0x10);
      UNLOCK();
      LOCK();
      (psVar23->bmp_size).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 0x18);
      UNLOCK();
      (psVar23->bmp)._M_b._M_p = *(__pointer_type *)((long)psVar28 + lVar26 + 0x20);
      LOCK();
      (psVar23->bmp_rcount).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 0x28);
      UNLOCK();
      LOCK();
      (psVar23->bmp_wcount).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 0x30);
      UNLOCK();
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138b96;
      pthread_spin_init(&psVar23->bmp_lock,1);
      pfVar14 = local_40;
      psVar23->bmp_prev_size = *(uint64_t *)((long)psVar28 + lVar26 + 0x40);
      psVar23->bmp_prev = *(uint8_t **)((long)psVar28 + lVar26 + 0x48);
      pvVar18 = *(void **)((_Invoker_type)((long)psVar28 + lVar26 + 0x50) + 8);
      (psVar23->bmp_idx).root = *(avl_node **)((long)psVar28 + lVar26 + 0x50);
      (psVar23->bmp_idx).aux = pvVar18;
      pdVar22 = *(docio_object **)((_Invoker_type)((long)psVar28 + lVar26 + 0x60) + 8);
      psVar23->bmp_doc_offset = *(bid_t **)((long)psVar28 + lVar26 + 0x60);
      psVar23->bmp_docs = pdVar22;
      uVar10 = *(uint64_t *)((_Invoker_type)((long)psVar28 + lVar26 + 0x70) + 8);
      psVar23->num_bmp_docs = *(uint64_t *)((long)psVar28 + lVar26 + 0x70);
      psVar23->num_init_free_blocks = uVar10;
      psVar23->num_free_blocks = *(uint64_t *)((long)psVar28 + lVar26 + 0x80);
      psVar23->rsv_bmp = *(sb_rsv_bmp **)((long)psVar28 + lVar26 + 0x88);
      LOCK();
      (psVar23->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 0x90);
      UNLOCK();
      LOCK();
      (psVar23->last_hdr_bid).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 0x98);
      UNLOCK();
      uVar10 = *(uint64_t *)((_Invoker_type)((long)psVar28 + lVar26 + 0xa0) + 8);
      psVar23->min_live_hdr_revnum = *(uint64_t *)((long)psVar28 + lVar26 + 0xa0);
      psVar23->min_live_hdr_bid = uVar10;
      LOCK();
      (psVar23->last_hdr_revnum).super___atomic_base<unsigned_long>._M_i =
           *(__int_type *)((long)psVar28 + lVar26 + 0xb0);
      UNLOCK();
      psVar23->num_alloc = *(uint64_t *)((long)psVar28 + lVar26 + 0xb8);
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138c48;
      pthread_spin_init(&psVar23->lock,1);
      if ((pfVar14->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i != 0xffffffffffffffff
         ) {
        LOCK();
        (pfVar14->last_commit).super___atomic_base<unsigned_long>._M_i =
             (long)pfVar14->config->blocksize *
             (pfVar14->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
        UNLOCK();
      }
      LOCK();
      paVar1 = &pfVar14->sb->revnum;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      psVar23 = pfVar14->sb;
      fVar24 = FDB_RESULT_SUCCESS;
      *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138c9c;
      avl_init(&psVar23->bmp_idx,(void *)0x0);
      if ((char)local_44 != '\0') {
        uVar30 = 0;
        do {
          if (uVar27 != uVar30) {
            *(undefined8 *)(local_2d8 + lVar8 + -8) = 0x138cb1;
            _sb_free(psVar28);
          }
          uVar30 = uVar30 + 1;
          psVar28 = psVar28 + 1;
        } while (local_70 != uVar30);
        fVar24 = FDB_RESULT_SUCCESS;
      }
    }
  }
  return fVar24;
}

Assistant:

fdb_status sb_read_latest(struct filemgr *file,
                          struct sb_config sconfig,
                          err_log_callback *log_callback)
{
    size_t i, max_sb_no = sconfig.num_sb;
    uint64_t max_revnum = 0;
    uint64_t revnum_limit = (uint64_t)0xffffffffffffffff;
    fdb_status fs;
    struct superblock *sb_arr;

    if (file->sb) {
        // Superblock is already read previously.
        // This means that there are some problems with the current superblock
        // so that we have to read another candidate.

        // Note: 'sb->revnum' denotes the revnum of next superblock to be
        // written, so we need to subtract 1 from it to get the revnum of
        // the current superblock successfully read from the file.
        revnum_limit = atomic_get_uint64_t(&file->sb->revnum) - 1;
        sb_free(file);
    }

    sb_arr = alca(struct superblock,
                  sconfig.num_sb * sizeof(struct superblock));
    memset(sb_arr, 0x0, sconfig.num_sb * sizeof(struct superblock));

    // read all superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        sb_arr[i].config = (struct sb_config*)calloc(1, sizeof(struct sb_config));
        _sb_init(&sb_arr[i], sconfig);
        fs = _sb_read_given_no(file, i, &sb_arr[i], log_callback);

        uint64_t cur_revnum = atomic_get_uint64_t(&sb_arr[i].revnum);
        if (fs == FDB_RESULT_SUCCESS &&
            cur_revnum >= max_revnum &&
            cur_revnum < revnum_limit) {
            max_sb_no = i;
            max_revnum = cur_revnum;
        }
    }

    if (max_sb_no == sconfig.num_sb) {
        // all superblocks are broken
        fs = FDB_RESULT_SB_READ_FAIL;
        for (i=0; i<sconfig.num_sb; ++i) {
            _sb_free(&sb_arr[i]);
        }
        // no readable superblock
        // (if not corrupted, it may be a normal old version file)
        return fs;
    }

    file->sb = (struct superblock*)calloc(1, sizeof(struct superblock));
    _sb_copy(file->sb, &sb_arr[max_sb_no]);

    // set last commit position
    if (atomic_get_uint64_t(&file->sb->cur_alloc_bid) != BLK_NOT_FOUND) {
        atomic_store_uint64_t(&file->last_commit,
                              atomic_get_uint64_t(&file->sb->cur_alloc_bid) *
                              file->config->blocksize);
    } else {
        // otherwise, last_commit == file->pos
        // (already set by filemgr_open() function)
    }

    atomic_incr_uint64_t(&file->sb->revnum);
    avl_init(&file->sb->bmp_idx, NULL);

    // free the other superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        if (i != max_sb_no) {
            _sb_free(&sb_arr[i]);
        }
    }

    return FDB_RESULT_SUCCESS;
}